

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O1

unique_ptr<mp::FlatModelInfo,_std::default_delete<mp::FlatModelInfo>_> mp::CreateFlatModelInfo(void)

{
  undefined8 *__s;
  __uniq_ptr_data<mp::FlatModelInfo,_std::default_delete<mp::FlatModelInfo>,_true,_true> in_RDI;
  
  __s = (undefined8 *)operator_new(0xd0);
  memset(__s,0,0xd0);
  *__s = &PTR__FlatModelInfoImpl_005d3ec0;
  __s[1] = __s + 7;
  __s[2] = 1;
  __s[3] = 0;
  __s[4] = 0;
  *(undefined4 *)(__s + 5) = 0x3f800000;
  __s[6] = 0;
  __s[7] = 0;
  __s[8] = __s + 0xe;
  __s[9] = 1;
  __s[10] = 0;
  __s[0xb] = 0;
  *(undefined4 *)(__s + 0xc) = 0x3f800000;
  __s[0xd] = 0;
  __s[0xe] = 0;
  *(undefined4 *)(__s + 0x10) = 0;
  __s[0x11] = 0;
  __s[0x12] = __s + 0x10;
  __s[0x13] = __s + 0x10;
  __s[0x14] = 0;
  __s[0x15] = 0;
  __s[0x16] = 0;
  __s[0x17] = 0;
  *(undefined4 *)(__s + 0x18) = 0;
  *(undefined8 **)
   in_RDI.super___uniq_ptr_impl<mp::FlatModelInfo,_std::default_delete<mp::FlatModelInfo>_>._M_t.
   super__Tuple_impl<0UL,_mp::FlatModelInfo_*,_std::default_delete<mp::FlatModelInfo>_>.
   super__Head_base<0UL,_mp::FlatModelInfo_*,_false>._M_head_impl = __s;
  return (__uniq_ptr_data<mp::FlatModelInfo,_std::default_delete<mp::FlatModelInfo>,_true,_true>)
         (tuple<mp::FlatModelInfo_*,_std::default_delete<mp::FlatModelInfo>_>)
         in_RDI.super___uniq_ptr_impl<mp::FlatModelInfo,_std::default_delete<mp::FlatModelInfo>_>.
         _M_t.super__Tuple_impl<0UL,_mp::FlatModelInfo_*,_std::default_delete<mp::FlatModelInfo>_>.
         super__Head_base<0UL,_mp::FlatModelInfo_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<FlatModelInfo> CreateFlatModelInfo() {
  return std::unique_ptr<FlatModelInfo>{new FlatModelInfoImpl()};
}